

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

bool __thiscall
tcb::unicode::detail::
unicode_view<std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>,_char16_t,_char>
::iterator::operator==(iterator *this,iterator *other)

{
  bool bVar1;
  
  bVar1 = done(this);
  if ((bVar1) && (bVar1 = done(other), bVar1)) {
    return true;
  }
  bVar1 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::equal
                    (&this->first_,&other->first_);
  if (((bVar1) &&
      (bVar1 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::equal
                         (&this->last_,&other->last_), bVar1)) && (this->idx_ == other->idx_)) {
    bVar1 = detail::operator==(&this->next_chars_,&other->next_chars_);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==(const iterator& other) const
        {
            return (done() && other.done()) ||
                    (first_ == other.first_ &&
                    last_ == other.last_ &&
                    idx_ == other.idx_ &&
                    next_chars_ == other.next_chars_);
        }